

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
* __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
try_emplace<std::unordered_map<(anonymous_namespace)::ns::MyCriterionType,(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>,(anonymous_namespace)::ns::EnumClassHash,std::equal_to<(anonymous_namespace)::ns::MyCriterionType>,std::allocator<std::pair<(anonymous_namespace)::ns::MyCriterionType_const,(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>>>>const&>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          string_view_type *key,
          unordered_map<(anonymous_namespace)::ns::MyCriterionType,_(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>,_(anonymous_namespace)::ns::EnumClassHash,_std::equal_to<(anonymous_namespace)::ns::MyCriterionType>,_std::allocator<std::pair<const_(anonymous_namespace)::ns::MyCriterionType,_(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>_>_>_>
          *args)

{
  json_storage_kind jVar1;
  undefined8 uVar2;
  string_view_type *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
  *in_RDI;
  type tVar3;
  type result_1;
  unordered_map<(anonymous_namespace)::ns::MyCriterionType,_(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>,_(anonymous_namespace)::ns::EnumClassHash,_std::equal_to<(anonymous_namespace)::ns::MyCriterionType>,_std::allocator<std::pair<const_(anonymous_namespace)::ns::MyCriterionType,_(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>_>_>_>
  *in_stack_00000080;
  string_view_type *in_stack_00000088;
  type result;
  bool *in_stack_ffffffffffffff48;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_ffffffffffffff50;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  not_an_object *in_stack_ffffffffffffff90;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  local_48;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_38;
  undefined1 local_30;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_28;
  undefined1 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  
  jVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::storage_kind(in_RSI);
  if (jVar1 == empty_object) {
    create_object_implicitly<std::allocator<char>>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50);
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50);
    object_storage::value_abi_cxx11_((object_storage *)in_stack_ffffffffffffff90);
    tVar3 = sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
            ::
            try_emplace<std::allocator<char>,std::unordered_map<(anonymous_namespace)::ns::MyCriterionType,(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>,(anonymous_namespace)::ns::EnumClassHash,std::equal_to<(anonymous_namespace)::ns::MyCriterionType>,std::allocator<std::pair<(anonymous_namespace)::ns::MyCriterionType_const,(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>>>>const&>
                      ((sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                        *)result.first._M_current,in_stack_00000088,in_stack_00000080);
    local_38 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)tVar3.first._M_current;
    local_30 = tVar3.second;
    local_28 = local_38;
    detail::
    random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
    ::random_access_iterator_wrapper
              (&local_48,
               (__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                )local_38);
    std::
    make_pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,void>,bool&>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else if (jVar1 == json_reference) {
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::json_reference_storage::value
              ((json_reference_storage *)0xcfaa40);
    try_emplace<std::unordered_map<(anonymous_namespace)::ns::MyCriterionType,(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>,(anonymous_namespace)::ns::EnumClassHash,std::equal_to<(anonymous_namespace)::ns::MyCriterionType>,std::allocator<std::pair<(anonymous_namespace)::ns::MyCriterionType_const,(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>>>>const&>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDX,in_RCX,
               (unordered_map<(anonymous_namespace)::ns::MyCriterionType,_(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>,_(anonymous_namespace)::ns::EnumClassHash,_std::equal_to<(anonymous_namespace)::ns::MyCriterionType>,_std::allocator<std::pair<const_(anonymous_namespace)::ns::MyCriterionType,_(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
  }
  else {
    if (jVar1 != object) {
      uVar2 = __cxa_allocate_exception(0x58);
      std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDX);
      std::basic_string_view<char,_std::char_traits<char>_>::length(in_RDX);
      not_an_object::not_an_object<char>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (size_t)in_stack_ffffffffffffff80._M_current);
      __cxa_throw(uVar2,&not_an_object::typeinfo,not_an_object::~not_an_object);
    }
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50);
    object_storage::value_abi_cxx11_((object_storage *)in_stack_ffffffffffffff90);
    tVar3 = sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
            ::
            try_emplace<std::allocator<char>,std::unordered_map<(anonymous_namespace)::ns::MyCriterionType,(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>,(anonymous_namespace)::ns::EnumClassHash,std::equal_to<(anonymous_namespace)::ns::MyCriterionType>,std::allocator<std::pair<(anonymous_namespace)::ns::MyCriterionType_const,(anonymous_namespace)::ns::TCriterion<(anonymous_namespace)::ns::MyCriterionType>>>>const&>
                      ((sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                        *)result.first._M_current,in_stack_00000088,in_stack_00000080);
    detail::
    random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
    ::random_access_iterator_wrapper
              ((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                *)&stack0xffffffffffffff80,tVar3.first._M_current);
    std::
    make_pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>,void>,bool&>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  return in_RDI;
}

Assistant:

std::pair<object_iterator,bool> try_emplace(const string_view_type& key, Args&&... args)
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                {
                    create_object_implicitly();
                    auto result = cast<object_storage>().value().try_emplace(key, std::forward<Args>(args)...);
                    return std::make_pair(object_iterator(result.first),result.second);
                }
                case json_storage_kind::object:
                {
                    auto result = cast<object_storage>().value().try_emplace(key, std::forward<Args>(args)...);
                    return std::make_pair(object_iterator(result.first),result.second);
                }
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().try_emplace(key, std::forward<Args>(args)...);
                default:
                    JSONCONS_THROW(not_an_object(key.data(),key.length()));
            }
        }